

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view.cpp
# Opt level: O2

void __thiscall
SStringViewInit_Empty_Test<(anonymous_namespace)::string_maker<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
::~SStringViewInit_Empty_Test
          (SStringViewInit_Empty_Test<(anonymous_namespace)::string_maker<std::unique_ptr<char[],_std::default_delete<char[]>_>_>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST (SStringViewInit, Empty) {
    using namespace pstore;
    TypeParam t;
    std::string const src;
    auto ptr = t (src);
    auto sv = make_sstring_view (std::move (ptr), src.length ());
    EXPECT_EQ (sv.size (), 0U);
    EXPECT_EQ (sv.length (), 0U);
    EXPECT_EQ (sv.max_size (), std::numeric_limits<std::size_t>::max ());
    EXPECT_TRUE (sv.empty ());
    EXPECT_EQ (std::distance (std::begin (sv), std::end (sv)), 0);
}